

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O0

char * __thiscall cppjieba::PosTagger::SpecialRule(PosTagger *this,RuneStrArray *unicode)

{
  size_t sVar1;
  RuneStr *pRVar2;
  bool bVar3;
  ulong local_38;
  size_t i;
  size_t eng;
  size_t m;
  RuneStrArray *unicode_local;
  PosTagger *this_local;
  
  eng = 0;
  i = 0;
  local_38 = 0;
  while( true ) {
    sVar1 = limonp::LocalVector<cppjieba::RuneStr>::size(unicode);
    bVar3 = false;
    if (local_38 < sVar1) {
      sVar1 = limonp::LocalVector<cppjieba::RuneStr>::size(unicode);
      bVar3 = i < sVar1 >> 1;
    }
    if (!bVar3) break;
    pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](unicode,local_38);
    if (pRVar2->rune < 0x80) {
      i = i + 1;
      pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](unicode,local_38);
      if ((0x2f < pRVar2->rune) &&
         (pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](unicode,local_38),
         pRVar2->rune < 0x3a)) {
        eng = eng + 1;
      }
    }
    local_38 = local_38 + 1;
  }
  if (i == 0) {
    this_local = (PosTagger *)anon_var_dwarf_1d908;
  }
  else if (eng == i) {
    this_local = (PosTagger *)anon_var_dwarf_1d913;
  }
  else {
    this_local = (PosTagger *)anon_var_dwarf_1d91e;
  }
  return (char *)this_local;
}

Assistant:

const char* SpecialRule(const RuneStrArray& unicode) const {
    size_t m = 0;
    size_t eng = 0;
    for (size_t i = 0; i < unicode.size() && eng < unicode.size() / 2; i++) {
      if (unicode[i].rune < 0x80) {
        eng ++;
        if ('0' <= unicode[i].rune && unicode[i].rune <= '9') {
          m++;
        }
      }
    }
    // ascii char is not found
    if (eng == 0) {
      return POS_X;
    }
    // all the ascii is number char
    if (m == eng) {
      return POS_M;
    }
    // the ascii chars contain english letter
    return POS_ENG;
  }